

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_rts(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  TCGv_i32 arg1;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pTVar1 = get_areg(s,7);
  pTVar1 = gen_load(s,2,pTVar1,0,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  ret = get_areg(s,7);
  arg1 = get_areg(s,7);
  tcg_gen_addi_i32_m68k(tcg_ctx_00,ret,arg1,4);
  gen_jmp(s,pTVar1);
  return;
}

Assistant:

DISAS_INSN(rts)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    tmp = gen_load(s, OS_LONG, QREG_SP, 0, IS_USER(s));
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, QREG_SP, 4);
    gen_jmp(s, tmp);
}